

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMixedMeshControl::CreateInternalFluxElements(TPZMHMixedMeshControl *this)

{
  int iVar1;
  int64_t iVar2;
  pair<long,_long> *ppVar3;
  TPZGeoEl *pTVar4;
  TPZGeoMesh *this_00;
  long lVar5;
  TPZCompMesh *pTVar6;
  long in_RDI;
  bool bVar7;
  pair<long,_int> pVar8;
  int j_1;
  TPZCompEl *cel;
  TPZGeoEl *gel;
  int j;
  int64_t elIndex;
  int64_t MHMDomain;
  int i_1;
  int64_t firstElemInMHMDomain;
  int64_t previousMHMDomain;
  int i;
  TPZManVector<std::pair<long,_long>,_10> MHMOfEachGeoEl;
  int64_t nel;
  TPZCompMesh *cmeshHDiv;
  int meshdim;
  TPZGeoMesh *gmesh;
  TPZGeoEl *in_stack_fffffffffffffdd8;
  TPZCompMesh *in_stack_fffffffffffffde0;
  pair<long,_long> *in_stack_fffffffffffffde8;
  TPZCompMesh *in_stack_fffffffffffffdf0;
  int64_t in_stack_fffffffffffffdf8;
  TPZManVector<long,_10> *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe10;
  key_type *in_stack_fffffffffffffe18;
  map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
  *in_stack_fffffffffffffe20;
  int64_t in_stack_fffffffffffffe38;
  TPZCreateApproximationSpace *in_stack_fffffffffffffe40;
  int local_164;
  int local_14c;
  int local_134;
  long local_128;
  pair<long,_int> local_100;
  int local_ec;
  TPZVec<std::pair<long,_long>_> local_e8 [6];
  long local_28;
  TPZCompMesh *local_20;
  int local_14;
  TPZGeoMesh *local_10;
  
  local_10 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  local_14 = TPZGeoMesh::Dimension(local_10);
  local_20 = TPZAutoPointer<TPZCompMesh>::operator->
                       ((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_fffffffffffffdf0);
  TPZCompMesh::LoadReferences(in_stack_fffffffffffffdf0);
  TPZCompMesh::SetDimModel(local_20,local_14);
  TPZCompMesh::ApproxSpace(local_20);
  TPZCreateApproximationSpace::SetAllCreateFunctionsHDiv
            (in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  TPZCompMesh::SetDefaultOrder(local_20,*(int *)(in_RDI + 0xb0));
  std::
  map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
  ::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  TPZManVector<long,_10>::Expand(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  local_28 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1f62ae7);
  iVar2 = TPZVec<long>::size((TPZVec<long> *)(in_RDI + 200));
  if (iVar2 != local_28) {
    pzinternal::DebugStopImpl((char *)nel,MHMOfEachGeoEl.fExtAlloc[9].second);
  }
  TPZManVector<std::pair<long,_long>,_10>::TPZManVector
            ((TPZManVector<std::pair<long,_long>,_10> *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38);
  for (local_ec = 0; local_ec < local_28; local_ec = local_ec + 1) {
    TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 200),(long)local_ec);
    pVar8 = std::make_pair<long&,int&>
                      ((long *)in_stack_fffffffffffffde0,(int *)in_stack_fffffffffffffdd8);
    local_100.first = pVar8.first;
    local_100.second = pVar8.second;
    ppVar3 = TPZVec<std::pair<long,_long>_>::operator[](local_e8,(long)local_ec);
    std::pair<long,long>::operator=((pair<long,long> *)ppVar3,&local_100);
  }
  TPZVec<std::pair<long,_long>_>::operator[](local_e8,0);
  TPZVec<std::pair<long,_long>_>::operator[](local_e8,local_28 + -1);
  std::sort<std::pair<long,long>*>
            ((pair<long,_long> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  local_128 = -1;
  local_164 = -1;
  for (local_134 = 0; iVar2 = TPZVec<std::pair<long,_long>_>::size(local_e8), local_134 < iVar2;
      local_134 = local_134 + 1) {
    ppVar3 = TPZVec<std::pair<long,_long>_>::operator[](local_e8,(long)local_134);
    lVar5 = ppVar3->first;
    TPZVec<std::pair<long,_long>_>::operator[](local_e8,(long)local_134);
    if (lVar5 != -1) {
      if ((lVar5 != local_128) &&
         (bVar7 = local_128 != -1, local_14c = local_164, local_128 = lVar5, local_164 = local_134,
         bVar7)) {
        for (; local_14c < local_134; local_14c = local_14c + 1) {
          TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
          TPZVec<std::pair<long,_long>_>::operator[](local_e8,(long)local_14c);
          pTVar4 = TPZGeoMesh::Element((TPZGeoMesh *)in_stack_fffffffffffffde0,
                                       (int64_t)in_stack_fffffffffffffdd8);
          TPZGeoEl::ResetReference(pTVar4);
        }
      }
      this_00 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
      pTVar4 = TPZGeoMesh::Element((TPZGeoMesh *)in_stack_fffffffffffffde0,
                                   (int64_t)in_stack_fffffffffffffdd8);
      if ((pTVar4 != (TPZGeoEl *)0x0) &&
         (iVar1 = (**(code **)(*(long *)pTVar4 + 0x1d0))(), iVar1 == 0)) {
        TPZCompMesh::CreateCompEl(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        TPZMHMeshControl::SetSubdomain
                  ((TPZMHMeshControl *)this_00,(TPZCompEl *)pTVar4,
                   CONCAT44(iVar1,in_stack_fffffffffffffe10));
      }
    }
  }
  while( true ) {
    lVar5 = (long)local_164;
    iVar2 = TPZVec<std::pair<long,_long>_>::size(local_e8);
    if (iVar2 <= lVar5) break;
    TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
    TPZVec<std::pair<long,_long>_>::operator[](local_e8,(long)local_164);
    in_stack_fffffffffffffde0 =
         (TPZCompMesh *)
         TPZGeoMesh::Element((TPZGeoMesh *)in_stack_fffffffffffffde0,
                             (int64_t)in_stack_fffffffffffffdd8);
    TPZGeoEl::ResetReference((TPZGeoEl *)in_stack_fffffffffffffde0);
    local_164 = local_164 + 1;
  }
  pTVar6 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  (**(code **)(*(long *)pTVar6 + 0x60))();
  TPZManVector<std::pair<long,_long>,_10>::~TPZManVector
            ((TPZManVector<std::pair<long,_long>,_10> *)in_stack_fffffffffffffde0);
  return;
}

Assistant:

void TPZMHMixedMeshControl::CreateInternalFluxElements() {
    TPZGeoMesh *gmesh = fGMesh.operator->();
    int meshdim = gmesh->Dimension();
    TPZCompMesh *cmeshHDiv = fFluxMesh.operator->();
    gmesh->ResetReference();
    cmeshHDiv->LoadReferences();
    cmeshHDiv->SetDimModel(meshdim);
    cmeshHDiv->ApproxSpace().SetAllCreateFunctionsHDiv(meshdim);
    cmeshHDiv->SetDefaultOrder(fpOrderInternal);

    // Create MHM computational elements
    fConnectToSubDomainIdentifier[cmeshHDiv].Expand(10000);
    int64_t nel = fGMesh->NElements();

    if (fGeoToMHMDomain.size() != nel) DebugStop();

    TPZManVector<std::pair<int64_t, int64_t>> MHMOfEachGeoEl(nel);
    for (int i = 0; i < nel; i++) {
        MHMOfEachGeoEl[i] = std::make_pair(fGeoToMHMDomain[i], i);
    }

    std::sort(&MHMOfEachGeoEl[0], &MHMOfEachGeoEl[nel - 1] + 1);

    int64_t previousMHMDomain = -1;
    int64_t firstElemInMHMDomain = -1;
    for (int i = 0; i < MHMOfEachGeoEl.size(); i++) {
        int64_t MHMDomain = MHMOfEachGeoEl[i].first;
        int64_t elIndex = MHMOfEachGeoEl[i].second;

        if (MHMDomain == -1) continue;

        if (MHMDomain != previousMHMDomain) {
            if (previousMHMDomain != -1) {
                for (int j = firstElemInMHMDomain; j < i; j++) {
                    fGMesh->Element(MHMOfEachGeoEl[j].second)->ResetReference();
                }
            }
            firstElemInMHMDomain = i;
            previousMHMDomain = MHMDomain;
        }

        // Create the flux element
        TPZGeoEl *gel = fGMesh->Element(elIndex);
        if (!gel || gel->HasSubElement()) continue;
        TPZCompEl* cel = cmeshHDiv->CreateCompEl(gel);
//        TPZCompEl *cel = cmeshHDiv->Element(index);
        // Associate the connects with the subdomain for the flux mesh
        SetSubdomain(cel, MHMDomain);
    }
    // Resets references of last MHM domain
    for (int j = firstElemInMHMDomain; j < MHMOfEachGeoEl.size(); j++) {
        fGMesh->Element(MHMOfEachGeoEl[j].second)->ResetReference();
    }

    fFluxMesh->ExpandSolution();
}